

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O0

void flexbuffers::AppendToString<flexbuffers::FixedTypedVector>
               (string *s,FixedTypedVector *v,bool keys_quoted,bool indented,int cur_indent,
               char *indent_string,bool natural_utf8)

{
  ulong uVar1;
  byte bVar2;
  char *local_60;
  char *local_50;
  Reference local_48;
  ulong local_38;
  size_t i;
  char *pcStack_28;
  bool natural_utf8_local;
  char *indent_string_local;
  int cur_indent_local;
  bool indented_local;
  bool keys_quoted_local;
  FixedTypedVector *v_local;
  string *s_local;
  
  i._7_1_ = natural_utf8;
  pcStack_28 = indent_string;
  indent_string_local._0_4_ = cur_indent;
  indent_string_local._6_1_ = indented;
  indent_string_local._7_1_ = keys_quoted;
  _cur_indent_local = v;
  v_local = (FixedTypedVector *)s;
  std::__cxx11::string::operator+=((string *)s,"[");
  if ((indent_string_local._6_1_ & 1) == 0) {
    local_50 = " ";
  }
  else {
    local_50 = "\n";
  }
  std::__cxx11::string::operator+=((string *)v_local,local_50);
  local_38 = 0;
  while( true ) {
    uVar1 = local_38;
    bVar2 = FixedTypedVector::size(_cur_indent_local);
    if (bVar2 <= uVar1) break;
    if (local_38 != 0) {
      std::__cxx11::string::operator+=((string *)v_local,",");
      if ((indent_string_local._6_1_ & 1) == 0) {
        local_60 = " ";
      }
      else {
        local_60 = "\n";
      }
      std::__cxx11::string::operator+=((string *)v_local,local_60);
    }
    if ((indent_string_local._6_1_ & 1) != 0) {
      IndentString((string *)v_local,(int)indent_string_local,pcStack_28);
    }
    local_48 = FixedTypedVector::operator[](_cur_indent_local,local_38);
    Reference::ToString(&local_48,true,(bool)(indent_string_local._7_1_ & 1),(string *)v_local,
                        (bool)(indent_string_local._6_1_ & 1),(int)indent_string_local,pcStack_28,
                        (bool)(i._7_1_ & 1));
    local_38 = local_38 + 1;
  }
  if ((indent_string_local._6_1_ & 1) == 0) {
    std::__cxx11::string::operator+=((string *)v_local," ");
  }
  else {
    std::__cxx11::string::operator+=((string *)v_local,"\n");
    IndentString((string *)v_local,(int)indent_string_local + -1,pcStack_28);
  }
  std::__cxx11::string::operator+=((string *)v_local,"]");
  return;
}

Assistant:

void AppendToString(std::string &s, T &&v, bool keys_quoted, bool indented,
                    int cur_indent, const char *indent_string,
                    bool natural_utf8) {
  s += "[";
  s += indented ? "\n" : " ";
  for (size_t i = 0; i < v.size(); i++) {
    if (i) {
      s += ",";
      s += indented ? "\n" : " ";
    }
    if (indented) IndentString(s, cur_indent, indent_string);
    v[i].ToString(true, keys_quoted, s, indented, cur_indent,
                  indent_string, natural_utf8);
  }
  if (indented) {
    s += "\n";
    IndentString(s, cur_indent - 1, indent_string);
  } else {
    s += " ";
  }
  s += "]";
}